

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::OutboundTargetReached(CConnman *this,bool historicalBlockServingLimit)

{
  seconds sVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock99;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  uVar2 = this->nMaxOutboundLimit;
  if (uVar2 != 0) {
    if (historicalBlockServingLimit) {
      sVar1 = GetMaxOutboundTimeLeftInCycle_(this);
      uVar2 = SUB168(SEXT816(sVar1.__r) * SEXT816(0x6d3a06d3a06d3a07),8);
      lVar3 = (uVar2 >> 8) - ((long)uVar2 >> 0x3f);
      bVar4 = true;
      uVar2 = this->nMaxOutboundLimit + lVar3 * -4000000;
      if (this->nMaxOutboundLimit < (ulong)(lVar3 * 4000000) || uVar2 == 0) goto LAB_001ae57f;
    }
    bVar4 = true;
    if (uVar2 <= this->nMaxOutboundTotalBytesSentInCycle) goto LAB_001ae57f;
  }
  bVar4 = false;
LAB_001ae57f:
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CConnman::OutboundTargetReached(bool historicalBlockServingLimit) const
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);
    if (nMaxOutboundLimit == 0)
        return false;

    if (historicalBlockServingLimit)
    {
        // keep a large enough buffer to at least relay each block once
        const std::chrono::seconds timeLeftInCycle = GetMaxOutboundTimeLeftInCycle_();
        const uint64_t buffer = timeLeftInCycle / std::chrono::minutes{10} * MAX_BLOCK_SERIALIZED_SIZE;
        if (buffer >= nMaxOutboundLimit || nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit - buffer)
            return true;
    }
    else if (nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit)
        return true;

    return false;
}